

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void dump_fnobj(LispPTR index)

{
  long lVar1;
  DLword **ppDVar2;
  
  if ((index & 0xfff0000) == 0) {
    ppDVar2 = &AtomSpace;
    lVar1 = (ulong)(index * 5) << 2;
  }
  else {
    if ((index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)index);
    }
    ppDVar2 = &Lisp_world;
    lVar1 = (ulong)index * 2;
  }
  dump_fnbody(*(LispPTR *)((long)*ppDVar2 + lVar1 + 8));
  return;
}

Assistant:

void dump_fnobj(LispPTR index)
/* atom index */
{
  LispPTR *defcell68k;

  defcell68k = GetDEFCELL68k(index);
  dump_fnbody(*defcell68k);

}